

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfdata.cpp
# Opt level: O0

void __thiscall PFData::PFData(PFData *this,double *data,int nz,int ny,int nx)

{
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  string *in_RDI;
  undefined4 in_R8D;
  allocator local_1d;
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 local_14;
  undefined8 local_10;
  
  local_1c = in_R8D;
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  std::__cxx11::string::string(in_RDI);
  *(undefined8 *)(in_RDI + 0x20) = 0;
  *(undefined8 *)(in_RDI + 0x28) = 0;
  *(undefined8 *)(in_RDI + 0x30) = 0;
  *(undefined8 *)(in_RDI + 0x38) = 0;
  *(undefined4 *)(in_RDI + 0x40) = local_14;
  *(undefined4 *)(in_RDI + 0x44) = local_18;
  *(undefined4 *)(in_RDI + 0x48) = local_1c;
  *(undefined8 *)(in_RDI + 0x50) = 0x3ff0000000000000;
  *(undefined8 *)(in_RDI + 0x58) = 0x3ff0000000000000;
  *(undefined8 *)(in_RDI + 0x60) = 0x3ff0000000000000;
  *(undefined4 *)(in_RDI + 0x68) = 0;
  *(undefined4 *)(in_RDI + 0x6c) = 1;
  *(undefined4 *)(in_RDI + 0x70) = 1;
  *(undefined4 *)(in_RDI + 0x74) = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI + 0x78,"zyx",&local_1d);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d);
  in_RDI[0x98] = (string)0x0;
  *(undefined8 *)(in_RDI + 0xa0) = local_10;
  return;
}

Assistant:

PFData::PFData(double *data, int nz, int ny, int nx)
    : m_data{data}, m_nz{nz}, m_ny{ny}, m_nx{nx} {}